

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runlength.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *filename;
  int iVar1;
  ostream *this;
  FILE *__stream;
  void *__buf;
  FILE *__n;
  size_t len;
  undefined1 local_128 [8];
  Pl_RunLength rl;
  undefined1 local_e8 [7];
  bool done;
  uchar buf [100];
  undefined1 local_78 [8];
  Pl_StdioFile out;
  FILE *outfile;
  FILE *infile;
  char *outfilename;
  char *infilename;
  bool encode;
  char **argv_local;
  int argc_local;
  
  if (argc == 4) {
    iVar1 = strcmp("-encode",argv[1]);
    filename = argv[3];
    __stream = (FILE *)QUtil::safe_fopen(argv[2],"rb");
    out.m._M_t.
    super___uniq_ptr_impl<Pl_StdioFile::Members,_std::default_delete<Pl_StdioFile::Members>_>._M_t.
    super__Tuple_impl<0UL,_Pl_StdioFile::Members_*,_std::default_delete<Pl_StdioFile::Members>_>.
    super__Head_base<0UL,_Pl_StdioFile::Members_*,_false>._M_head_impl =
         (__uniq_ptr_data<Pl_StdioFile::Members,_std::default_delete<Pl_StdioFile::Members>,_true,_true>
          )QUtil::safe_fopen(filename,"wb");
    Pl_StdioFile::Pl_StdioFile
              ((Pl_StdioFile *)local_78,"stdout",
               (FILE *)out.m._M_t.
                       super___uniq_ptr_impl<Pl_StdioFile::Members,_std::default_delete<Pl_StdioFile::Members>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Pl_StdioFile::Members_*,_std::default_delete<Pl_StdioFile::Members>_>
                       .super__Head_base<0UL,_Pl_StdioFile::Members_*,_false>._M_head_impl);
    rl.m._M_t.
    super___uniq_ptr_impl<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>._M_t.
    super__Tuple_impl<0UL,_Pl_RunLength::Members_*,_std::default_delete<Pl_RunLength::Members>_>.
    super__Head_base<0UL,_Pl_RunLength::Members_*,_false>._M_head_impl._7_1_ = 0;
    Pl_RunLength::Pl_RunLength
              ((Pl_RunLength *)local_128,"runlength",(Pipeline *)local_78,
               (byte)~(iVar1 == 0) & a_decode);
    while (((rl.m._M_t.
             super___uniq_ptr_impl<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>
             ._M_t.
             super__Tuple_impl<0UL,_Pl_RunLength::Members_*,_std::default_delete<Pl_RunLength::Members>_>
             .super__Head_base<0UL,_Pl_RunLength::Members_*,_false>._M_head_impl._7_1_ ^ 0xff) & 1)
           != 0) {
      __n = __stream;
      __buf = (void *)fread(local_e8,1,100,__stream);
      if (__buf == (void *)0x0) {
        rl.m._M_t.
        super___uniq_ptr_impl<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>.
        _M_t.
        super__Tuple_impl<0UL,_Pl_RunLength::Members_*,_std::default_delete<Pl_RunLength::Members>_>
        .super__Head_base<0UL,_Pl_RunLength::Members_*,_false>._M_head_impl._7_1_ = 1;
      }
      else {
        Pl_RunLength::write((Pl_RunLength *)local_128,(int)local_e8,__buf,(size_t)__n);
      }
    }
    Pl_RunLength::finish((Pl_RunLength *)local_128);
    fclose(__stream);
    fclose((FILE *)out.m._M_t.
                   super___uniq_ptr_impl<Pl_StdioFile::Members,_std::default_delete<Pl_StdioFile::Members>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Pl_StdioFile::Members_*,_std::default_delete<Pl_StdioFile::Members>_>
                   .super__Head_base<0UL,_Pl_StdioFile::Members_*,_false>._M_head_impl);
    Pl_RunLength::~Pl_RunLength((Pl_RunLength *)local_128);
    Pl_StdioFile::~Pl_StdioFile((Pl_StdioFile *)local_78);
    return 0;
  }
  this = std::operator<<((ostream *)&std::cerr,"Usage: runlength {-encode|-decode} infile outfile");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  exit(2);
}

Assistant:

int
main(int argc, char* argv[])
{
    if (argc != 4) {
        std::cerr << "Usage: runlength {-encode|-decode} infile outfile" << std::endl;
        exit(2);
    }

    bool encode = (strcmp("-encode", argv[1]) == 0);
    char* infilename = argv[2];
    char* outfilename = argv[3];

    FILE* infile = QUtil::safe_fopen(infilename, "rb");
    FILE* outfile = QUtil::safe_fopen(outfilename, "wb");
    Pl_StdioFile out("stdout", outfile);
    unsigned char buf[100];
    bool done = false;
    Pl_RunLength rl("runlength", &out, (encode ? Pl_RunLength::a_encode : Pl_RunLength::a_decode));
    while (!done) {
        size_t len = fread(buf, 1, sizeof(buf), infile);
        if (len <= 0) {
            done = true;
        } else {
            rl.write(buf, len);
        }
    }
    rl.finish();
    fclose(infile);
    fclose(outfile);
    return 0;
}